

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O3

void __thiscall CompressedArray::const_iterator::read_value(const_iterator *this)

{
  CompressedArray *pCVar1;
  uint32_t uVar2;
  
  uVar2 = read_number(this,this->array->ngram_count_index_log_radix);
  pCVar1 = this->array;
  (this->record).value.ngram_count =
       (pCVar1->ngram_count_values).words.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start[uVar2];
  uVar2 = read_number(this,pCVar1->continuations_count_index_log_radix);
  pCVar1 = this->array;
  (this->record).value.continuations_count =
       (pCVar1->continuations_count_values).words.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start[uVar2];
  uVar2 = read_number(this,pCVar1->unique_continuations_count_index_log_radix);
  (this->record).value.unique_continuations_count =
       (this->array->unique_continuations_count_values).words.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start[uVar2];
  return;
}

Assistant:

void CompressedArray::const_iterator::read_value() {
    uint32_t index = read_number(array->ngram_count_index_log_radix);
    record.value.ngram_count = array->ngram_count_values[index];
    index = read_number(array->continuations_count_index_log_radix);
    record.value.continuations_count = array->continuations_count_values[index];
    index = read_number(array->unique_continuations_count_index_log_radix);
    record.value.unique_continuations_count = array->unique_continuations_count_values[index];
}